

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O0

string_view bloaty::dwarf::AttrValue::ReadBlock<unsigned_int>(string_view *data)

{
  uint uVar1;
  string_view sVar2;
  string_view sVar3;
  uint len;
  string_view *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  uVar1 = ReadFixed<unsigned_int,4ul>
                    ((string_view *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  sVar2 = ReadBytes(CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  sVar3._M_len = sVar2._M_len;
  sVar3._M_str = sVar2._M_str;
  return sVar3;
}

Assistant:

string_view AttrValue::ReadBlock(string_view* data) {
  D len = ReadFixed<D>(data);
  return ReadBytes(len, data);
}